

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O3

HttpPost * __thiscall curlpp::HttpPost::operator=(HttpPost *this,Forms *posts)

{
  size_t *psVar1;
  _Node *p_Var2;
  FormPart *pFVar3;
  _List_node_base *p_Var4;
  
  clear(this);
  p_Var4 = (posts->
           super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)posts) {
    do {
      p_Var2 = std::__cxx11::
               list<utilspp::clone_ptr<curlpp::FormPart>,std::allocator<utilspp::clone_ptr<curlpp::FormPart>>>
               ::_M_create_node<utilspp::clone_ptr<curlpp::FormPart>const&>
                         ((list<utilspp::clone_ptr<curlpp::FormPart>,std::allocator<utilspp::clone_ptr<curlpp::FormPart>>>
                           *)&this->mForms,(clone_ptr<curlpp::FormPart> *)(p_Var4 + 1));
      std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
      psVar1 = &(this->mForms).
                super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pFVar3 = utilspp::clone_ptr<curlpp::FormPart>::operator->
                         ((clone_ptr<curlpp::FormPart> *)
                          ((this->mForms).
                           super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                           ._M_impl._M_node.super__List_node_base._M_prev + 1));
      (*pFVar3->_vptr_FormPart[3])(pFVar3,this,&this->mLast);
      p_Var4 = (((_List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)posts);
  }
  return this;
}

Assistant:

curlpp::HttpPost &
curlpp::HttpPost::operator=(const Forms & posts)
{
  clear();

  Forms::const_iterator pos;
  for(pos = posts.begin(); pos != posts.end(); pos++) 
  {
    mForms.push_back(*pos);
    mForms.back()->add(&mFirst, &mLast);
  } 

  return (*this);
}